

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall Palette::~Palette(Palette *this)

{
  Colour *this_00;
  map<int,Colour*,std::less<int>,std::allocator<std::pair<int_const,Colour*>>> *this_01;
  map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_> *this_02;
  bool bVar1;
  pointer ppVar2;
  _Self __position;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_int,_Colour_*>_> local_18;
  iterator it;
  Palette *this_local;
  
  it._M_node = (_Base_ptr)this;
  std::_Rb_tree_iterator<std::pair<const_int,_Colour_*>_>::_Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_>::
             begin(this->colours);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_>::
         end(this->colours);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_Colour_*>_>::operator->(&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (Colour *)0x0) {
      Colour::~Colour(this_00);
      operator_delete(this_00);
    }
    this_01 = (map<int,Colour*,std::less<int>,std::allocator<std::pair<int_const,Colour*>>> *)
              this->colours;
    __position = std::_Rb_tree_iterator<std::pair<const_int,_Colour_*>_>::operator++(&local_18,0);
    std::map<int,Colour*,std::less<int>,std::allocator<std::pair<int_const,Colour*>>>::
    erase_abi_cxx11_(this_01,(iterator)__position._M_node);
  }
  this_02 = this->colours;
  if (this_02 !=
      (map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_> *)0x0) {
    std::map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_>::~map
              (this_02);
    operator_delete(this_02);
  }
  this->colours =
       (map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_> *)0x0;
  return;
}

Assistant:

Palette::~Palette() {
    map<int, Colour*>::iterator it;
    for (it = colours->begin(); it != colours->end();) {
        delete it->second;
        colours->erase(it++);
    }
    delete colours;
    colours = nullptr;
}